

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86.cpp
# Opt level: O3

int __thiscall ncnn::DeformableConv2D_x86::create_pipeline(DeformableConv2D_x86 *this,Option *opt)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Allocator *pAVar4;
  void *pvVar5;
  long *plVar6;
  ulong uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  Mat *pMVar10;
  uint _h;
  _func_int **pp_Var11;
  Layer *pLVar12;
  undefined4 *puVar13;
  int *piVar14;
  uint _h_00;
  int _elempack;
  ulong uVar15;
  undefined4 *puVar16;
  long lVar17;
  int k;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  undefined4 *puVar21;
  _func_int *p_Var22;
  long lVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  uint uVar27;
  undefined4 *puVar28;
  ParamDict pd_5;
  ParamDict pd;
  ParamDict local_178;
  Option *local_168;
  void *local_160;
  Mat local_158;
  undefined8 local_110;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 local_f8;
  undefined8 local_f0;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined4 local_d8;
  undefined8 local_d0;
  DeformableConv2D_x86 *local_c0;
  void *local_b8;
  undefined4 *local_b0;
  ModelBinFromMatArray local_a8;
  Mat local_98;
  undefined4 *local_50;
  Mat *local_48;
  long local_40;
  long local_38;
  
  pp_Var11 = this->_vptr_DeformableConv2D_x86;
  p_Var22 = pp_Var11[-3];
  switch(*(undefined4 *)(&this->field_0x104 + (long)p_Var22)) {
  case 1:
    pLVar12 = create_layer(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_158);
    (*pLVar12->_vptr_Layer[2])(pLVar12,&local_158);
    break;
  case 2:
    pLVar12 = create_layer(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_158);
    ParamDict::set((ParamDict *)&local_158,0,**(float **)(&this->field_0x108 + (long)p_Var22));
    (*pLVar12->_vptr_Layer[2])(pLVar12,&local_158);
    break;
  case 3:
    pLVar12 = create_layer(0x36);
    ParamDict::ParamDict((ParamDict *)&local_158);
    ParamDict::set((ParamDict *)&local_158,0,**(float **)(&this->field_0x108 + (long)p_Var22));
    ParamDict::set((ParamDict *)&local_158,1,
                   *(float *)(*(long *)(&this->field_0x108 + (long)p_Var22) + 4));
    (*pLVar12->_vptr_Layer[2])(pLVar12,&local_158);
    break;
  case 4:
    pLVar12 = create_layer(0x1e);
    ParamDict::ParamDict((ParamDict *)&local_158);
    (*pLVar12->_vptr_Layer[2])(pLVar12,&local_158);
    break;
  case 5:
    pLVar12 = create_layer(0x47);
    ParamDict::ParamDict((ParamDict *)&local_158);
    (*pLVar12->_vptr_Layer[2])(pLVar12,&local_158);
    break;
  case 6:
    pLVar12 = create_layer(0x43);
    ParamDict::ParamDict((ParamDict *)&local_158);
    ParamDict::set((ParamDict *)&local_158,0,**(float **)(&this->field_0x108 + (long)p_Var22));
    ParamDict::set((ParamDict *)&local_158,1,
                   *(float *)(*(long *)(&this->field_0x108 + (long)p_Var22) + 4));
    (*pLVar12->_vptr_Layer[2])(pLVar12,&local_158);
    break;
  default:
    pLVar12 = (Layer *)0x0;
    goto LAB_00523798;
  }
  ParamDict::~ParamDict((ParamDict *)&local_158);
  (*pLVar12->_vptr_Layer[4])(pLVar12,opt);
  pp_Var11 = this->_vptr_DeformableConv2D_x86;
LAB_00523798:
  this->activation = pLVar12;
  p_Var22 = pp_Var11[-3];
  iVar1 = *(int *)(&this->field_0xd4 + (long)p_Var22);
  lVar25 = (long)iVar1;
  iVar2 = *(int *)(&this->field_0xd8 + (long)p_Var22);
  _h_00 = iVar2 * iVar1;
  uVar3 = *(uint *)(&this->field_0xd0 + (long)p_Var22);
  local_b8 = (void *)(ulong)uVar3;
  uVar15 = (long)*(int *)(&this->field_0x100 + (long)p_Var22) / (long)(int)_h_00;
  uVar15 = (ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 | uVar15 & 0xffffffff;
  uVar19 = (long)uVar15 / (long)(int)uVar3;
  _h = (uint)uVar19;
  iVar24 = 1;
  uVar27 = 1;
  if (opt->use_packing_layout == true) {
    uVar27 = (uint)((uVar19 & 3) == 0) * 3 + 1;
    iVar24 = (uint)((uVar3 & 3) == 0) * 3 + 1;
  }
  local_168 = opt;
  local_c0 = this;
  if (opt->use_sgemm_convolution == true) {
    pLVar12 = create_layer(0x4a);
    this->gemm = pLVar12;
    ParamDict::ParamDict(&local_178);
    ParamDict::set(&local_178,2,0);
    ParamDict::set(&local_178,3,0);
    ParamDict::set(&local_178,4,1);
    ParamDict::set(&local_178,5,0);
    ParamDict::set(&local_178,6,1);
    ParamDict::set(&local_178,7,
                   *(int *)(&this->field_0xd0 + (long)this->_vptr_DeformableConv2D_x86[-3]));
    ParamDict::set(&local_178,8,0);
    ParamDict::set(&local_178,9,_h * _h_00);
    ParamDict::set(&local_178,10,
                   -(uint)(*(int *)(&this->field_0xfc + (long)this->_vptr_DeformableConv2D_x86[-3])
                          == 0) | 1);
    ParamDict::set(&local_178,0xb,1);
    (*this->gemm->_vptr_Layer[2])(this->gemm,&local_178);
    local_98.cstep = 0;
    local_98.data = (void *)0x0;
    local_98.refcount._0_4_ = 0;
    local_98.refcount._4_4_ = 0;
    local_98.elemsize._0_4_ = 0;
    local_98.elemsize._4_4_ = 0;
    local_98.elempack = 0;
    local_98.allocator = (Allocator *)0x0;
    local_98.dims = 0;
    local_98.w = 0;
    local_98.h = 0;
    local_98.d = 0;
    local_98.c = 0;
    Mat::reshape(&local_158,(Mat *)(&this->field_0x150 + (long)this->_vptr_DeformableConv2D_x86[-3])
                 ,_h_00,_h,
                 (int)((Mat *)(&this->field_0x150 + (long)this->_vptr_DeformableConv2D_x86[-3]))[-2]
                      .elemsize,(Allocator *)0x0);
    Mat::create(&local_98,_h * _h_00,
                *(int *)(&this->field_0xd0 + (long)this->_vptr_DeformableConv2D_x86[-3]),4,
                (Allocator *)0x0);
    opt = local_168;
    pp_Var11 = this->_vptr_DeformableConv2D_x86;
    p_Var22 = pp_Var11[-3];
    if (0 < *(int *)(&this->field_0xd0 + (long)p_Var22)) {
      local_160 = local_98.data;
      uVar15 = (ulong)uVar27;
      lVar25 = 0;
      do {
        if ((int)uVar27 <= (int)_h) {
          lVar23 = (long)local_158.w *
                   CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize);
          puVar13 = (undefined4 *)
                    (CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize) *
                     local_158.cstep * lVar25 + (long)local_158.data);
          puVar21 = (undefined4 *)
                    ((long)local_98.w *
                     CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize) * lVar25 +
                    (long)local_98.data);
          lVar26 = 0;
          do {
            if (0 < (int)_h_00) {
              uVar18 = 0;
              uVar19 = uVar15;
              puVar28 = puVar13;
              puVar16 = puVar13;
              do {
                do {
                  *puVar21 = *puVar28;
                  puVar21 = puVar21 + 1;
                  uVar19 = uVar19 - 1;
                  puVar28 = (undefined4 *)((long)puVar28 + lVar23);
                } while (uVar19 != 0);
                uVar18 = uVar18 + 1;
                puVar28 = puVar16 + 1;
                uVar19 = uVar15;
                puVar16 = puVar28;
              } while (uVar18 != _h_00);
            }
            lVar26 = lVar26 + uVar15;
            puVar13 = (undefined4 *)((long)puVar13 + lVar23 * uVar15);
          } while (lVar26 < (long)((long)(int)_h - (ulong)(uVar27 - 1)));
          p_Var22 = pp_Var11[-3];
          this = local_c0;
        }
        lVar25 = lVar25 + 1;
      } while (lVar25 < *(int *)(&this->field_0xd0 + (long)p_Var22));
    }
    piVar14 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + -1;
      UNLOCK();
      if (*piVar14 == 0) {
        if (local_158.allocator == (Allocator *)0x0) {
          if (local_158.data != (void *)0x0) {
            free(local_158.data);
          }
        }
        else {
          (*(local_158.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (*(int *)(&this->field_0xfc + (long)this->_vptr_DeformableConv2D_x86[-3]) == 0) {
      piVar14 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + 1;
        UNLOCK();
      }
      local_158.data = local_98.data;
      local_158.refcount._0_4_ = local_98.refcount._0_4_;
      local_158.refcount._4_4_ = local_98.refcount._4_4_;
      local_158.elemsize._0_4_ = (undefined4)local_98.elemsize;
      local_158.elemsize._4_4_ = local_98.elemsize._4_4_;
      local_158.elempack = local_98.elempack;
      local_158.allocator = local_98.allocator;
      local_158.dims = local_98.dims;
      local_158.w = local_98.w;
      local_158.h = local_98.h;
      local_158.d = local_98.d;
      local_158.c = local_98.c;
      local_158.cstep = local_98.cstep;
      pLVar12 = this->gemm;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_a8,&local_158);
      (*pLVar12->_vptr_Layer[3])(pLVar12,&local_a8);
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_a8);
      piVar14 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          if (local_158.allocator == (Allocator *)0x0) {
            if (local_158.data != (void *)0x0) {
              free(local_158.data);
            }
          }
          else {
            (*(local_158.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      piVar14 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + 1;
        UNLOCK();
      }
      local_d0 = 0;
      local_d8 = 0;
      uStack_dc = 0;
      uStack_e0 = 0;
      uStack_e4 = 0;
      uStack_e8 = 0;
      local_f0 = 0;
      local_f8 = 0;
      uStack_fc = 0;
      local_100 = 0;
      uStack_104 = 0;
      uStack_108 = 0;
      local_110 = 0;
      p_Var22 = this->_vptr_DeformableConv2D_x86[-3];
      if (&local_110 != (undefined8 *)(&this->field_0x198 + (long)p_Var22)) {
        piVar14 = *(int **)(&this->field_0x1a0 + (long)p_Var22);
        if (piVar14 != (int *)0x0) {
          LOCK();
          *piVar14 = *piVar14 + 1;
          UNLOCK();
        }
        local_110 = *(undefined8 *)(&this->field_0x198 + (long)p_Var22);
        uStack_108 = (undefined4)*(undefined8 *)(&this->field_0x1a0 + (long)p_Var22);
        uStack_104 = (undefined4)
                     ((ulong)*(undefined8 *)(&this->field_0x1a0 + (long)p_Var22) >> 0x20);
        local_100 = (undefined4)*(undefined8 *)(&this->field_0x1a8 + (long)p_Var22);
        uStack_fc = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1a8 + (long)p_Var22) >> 0x20)
        ;
        local_f8 = *(undefined4 *)(&this->field_0x1b0 + (long)p_Var22);
        local_f0 = *(undefined8 *)(&this->field_0x1b8 + (long)p_Var22);
        uStack_e8 = (undefined4)*(undefined8 *)(&this->field_0x1c0 + (long)p_Var22);
        uStack_e4 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1c0 + (long)p_Var22) >> 0x20)
        ;
        uStack_e0 = (undefined4)*(undefined8 *)(&this->field_0x1c8 + (long)p_Var22);
        uStack_dc = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1c8 + (long)p_Var22) >> 0x20)
        ;
        local_d8 = *(undefined4 *)(&this->field_0x1d0 + (long)p_Var22);
        local_d0 = *(undefined8 *)(&this->field_0x1d8 + (long)p_Var22);
      }
      local_158.cstep = local_98.cstep;
      local_158.c = local_98.c;
      local_158.d = local_98.d;
      local_158.h = local_98.h;
      local_158.w = local_98.w;
      local_158.dims = local_98.dims;
      local_158.allocator = local_98.allocator;
      local_158.elempack = local_98.elempack;
      local_158.elemsize._4_4_ = local_98.elemsize._4_4_;
      local_158.elemsize._0_4_ = (undefined4)local_98.elemsize;
      local_158.refcount._4_4_ = local_98.refcount._4_4_;
      local_158.refcount._0_4_ = local_98.refcount._0_4_;
      local_158.data = local_98.data;
      pLVar12 = this->gemm;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_a8,&local_158);
      (*pLVar12->_vptr_Layer[3])(pLVar12,&local_a8);
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_a8);
      lVar25 = 0x48;
      do {
        piVar14 = *(int **)((long)&local_158.refcount + lVar25);
        if (piVar14 != (int *)0x0) {
          LOCK();
          *piVar14 = *piVar14 + -1;
          UNLOCK();
          if (*piVar14 == 0) {
            pvVar5 = *(void **)((long)&local_158.data + lVar25);
            plVar6 = *(long **)((long)&local_158.allocator + lVar25);
            if (plVar6 == (long *)0x0) {
              if (pvVar5 != (void *)0x0) {
                free(pvVar5);
              }
            }
            else {
              (**(code **)(*plVar6 + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_158.cstep + lVar25) = 0;
        *(undefined8 *)((long)&local_158.refcount + lVar25 + 4) = 0;
        *(undefined8 *)((long)&local_158.elemsize + lVar25 + 4) = 0;
        *(undefined8 *)((long)&local_158.data + lVar25) = 0;
        *(undefined8 *)((long)&local_158.refcount + lVar25) = 0;
        *(undefined8 *)((long)&local_158.dims + lVar25) = 0;
        *(undefined8 *)((long)&local_158.h + lVar25) = 0;
        *(undefined4 *)((long)&local_158.c + lVar25) = 0;
        lVar25 = lVar25 + -0x48;
      } while (lVar25 != -0x48);
    }
    (*this->gemm->_vptr_Layer[4])(this->gemm,opt);
    piVar14 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + -1;
      UNLOCK();
      if (*piVar14 == 0) {
        if (local_98.allocator == (Allocator *)0x0) {
          if (local_98.data != (void *)0x0) {
            free(local_98.data);
          }
        }
        else {
          (*(local_98.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    ParamDict::~ParamDict(&local_178);
  }
  else if ((iVar24 == 1) && (uVar27 == 1)) {
    if (p_Var22 != (_func_int *)0xfffffffffffffec0) {
      piVar14 = *(int **)(&this->field_0x158 + (long)p_Var22);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + 1;
        UNLOCK();
      }
      piVar14 = (this->weight_data_tm).refcount;
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          pvVar5 = (this->weight_data_tm).data;
          pAVar4 = (this->weight_data_tm).allocator;
          if (pAVar4 == (Allocator *)0x0) {
            if (pvVar5 != (void *)0x0) {
              free(pvVar5);
            }
          }
          else {
            (*pAVar4->_vptr_Allocator[3])
                      (pAVar4,pvVar5,(long)uVar15 % (long)(int)uVar3 & 0xffffffff);
          }
        }
      }
      (this->weight_data_tm).cstep = 0;
      *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
      *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
      (this->weight_data_tm).data = (void *)0x0;
      (this->weight_data_tm).refcount = (int *)0x0;
      (this->weight_data_tm).dims = 0;
      (this->weight_data_tm).w = 0;
      (this->weight_data_tm).h = 0;
      (this->weight_data_tm).d = 0;
      (this->weight_data_tm).c = 0;
      piVar14 = *(int **)((long)(&this->field_0x150 + (long)p_Var22) + 8);
      (this->weight_data_tm).data = *(void **)(&this->field_0x150 + (long)p_Var22);
      (this->weight_data_tm).refcount = piVar14;
      (this->weight_data_tm).elemsize = *(size_t *)(&this->field_0x160 + (long)p_Var22);
      (this->weight_data_tm).elempack = *(int *)(&this->field_0x168 + (long)p_Var22);
      (this->weight_data_tm).allocator = *(Allocator **)(&this->field_0x170 + (long)p_Var22);
      uVar8 = *(undefined8 *)(&this->field_0x178 + (long)p_Var22);
      uVar9 = *(undefined8 *)((long)(&this->field_0x178 + (long)p_Var22) + 8);
      (this->weight_data_tm).dims = (int)uVar8;
      (this->weight_data_tm).w = (int)((ulong)uVar8 >> 0x20);
      (this->weight_data_tm).h = (int)uVar9;
      (this->weight_data_tm).d = (int)((ulong)uVar9 >> 0x20);
      (this->weight_data_tm).c = *(int *)(&this->field_0x188 + (long)p_Var22);
      (this->weight_data_tm).cstep = *(size_t *)(&this->field_0x190 + (long)p_Var22);
    }
  }
  else {
    local_48 = &this->weight_data_tm;
    local_50 = *(undefined4 **)(&this->field_0x150 + (long)p_Var22);
    _elempack = uVar27 * iVar24;
    Mat::create(local_48,(int)(_h * _h_00 * uVar3) / _elempack,(ulong)(uint)(_elempack * 4),
                _elempack,(Allocator *)0x0);
    pMVar10 = local_48;
    if (0 < (int)uVar3) {
      pvVar5 = (local_c0->weight_data_tm).data;
      lVar26 = iVar2 * lVar25;
      lVar23 = (int)_h * lVar26;
      local_40 = lVar23 * 4;
      local_38 = lVar25 * 4;
      local_160 = (void *)0x0;
      do {
        if (0 < iVar2) {
          local_b0 = local_50;
          lVar20 = 0;
          do {
            if (0 < iVar1) {
              lVar17 = 0;
              puVar13 = local_b0;
              do {
                if (0 < (int)_h) {
                  uVar15 = (ulong)(uint)((int)local_160 >> 0x1f) << 0x20 |
                           (ulong)local_160 & 0xffffffff;
                  uVar18 = 0;
                  puVar21 = puVar13;
                  do {
                    uVar7 = (ulong)(uint)((int)uVar18 >> 0x1f) << 0x20 | uVar18 & 0xffffffff;
                    *(undefined4 *)
                     ((long)pvVar5 +
                     (long)(int)((((int)((long)uVar7 / (long)(int)uVar27) +
                                  ((int)lVar17 +
                                  ((int)((long)uVar15 / (long)iVar24) * iVar2 + (int)lVar20) * iVar1
                                  ) * (_h / uVar27)) * uVar27 +
                                 (int)((long)uVar7 % (long)(int)uVar27)) * iVar24 +
                                (int)((long)uVar15 % (long)iVar24)) * 4) = *puVar21;
                    uVar18 = uVar18 + 1;
                    puVar21 = puVar21 + lVar26;
                  } while ((uVar19 & 0xffffffff) != uVar18);
                }
                lVar17 = lVar17 + 1;
                puVar13 = puVar13 + 1;
              } while (lVar17 != lVar25);
            }
            lVar20 = lVar20 + 1;
            local_b0 = local_b0 + lVar25;
          } while (lVar20 != iVar2);
        }
        local_160 = (void *)((long)local_160 + 1);
        local_50 = local_50 + lVar23;
      } while (local_160 != local_b8);
    }
    Mat::reshape(&local_158,local_48,(int)_h / (int)uVar27,_h_00,
                 (int)((long)((ulong)(uint)((int)local_b8 >> 0x1f) << 0x20 |
                             (ulong)local_b8 & 0xffffffff) / (long)iVar24),(Allocator *)0x0);
    this = local_c0;
    opt = local_168;
    piVar14 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
    if (&local_158 != pMVar10) {
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + 1;
        UNLOCK();
      }
      piVar14 = (local_c0->weight_data_tm).refcount;
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          pvVar5 = (local_c0->weight_data_tm).data;
          pAVar4 = (local_c0->weight_data_tm).allocator;
          if (pAVar4 == (Allocator *)0x0) {
            if (pvVar5 != (void *)0x0) {
              free(pvVar5);
            }
          }
          else {
            (*pAVar4->_vptr_Allocator[3])();
          }
        }
      }
      (this->weight_data_tm).data = local_158.data;
      piVar14 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
      (this->weight_data_tm).refcount = piVar14;
      (this->weight_data_tm).elemsize =
           CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize);
      (this->weight_data_tm).elempack = local_158.elempack;
      (this->weight_data_tm).allocator = local_158.allocator;
      (this->weight_data_tm).dims = local_158.dims;
      (this->weight_data_tm).w = local_158.w;
      (this->weight_data_tm).h = local_158.h;
      (this->weight_data_tm).d = local_158.d;
      (this->weight_data_tm).c = local_158.c;
      (this->weight_data_tm).cstep = local_158.cstep;
    }
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + -1;
      UNLOCK();
      if (*piVar14 == 0) {
        if (local_158.allocator == (Allocator *)0x0) {
          if (local_158.data != (void *)0x0) {
            free(local_158.data);
          }
        }
        else {
          (*(local_158.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  if (opt->lightmode == true) {
    p_Var22 = this->_vptr_DeformableConv2D_x86[-3];
    piVar14 = *(int **)(&this->field_0x158 + (long)p_Var22);
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + -1;
      UNLOCK();
      if (*piVar14 == 0) {
        if (*(long **)(&this->field_0x170 + (long)p_Var22) == (long *)0x0) {
          if (*(void **)(&this->field_0x150 + (long)p_Var22) != (void *)0x0) {
            free(*(void **)(&this->field_0x150 + (long)p_Var22));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x170 + (long)p_Var22) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x190 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x15c + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x164 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x150 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x158 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x178 + (long)p_Var22) = 0;
    *(undefined8 *)(&this->field_0x180 + (long)p_Var22) = 0;
    *(undefined4 *)(&this->field_0x188 + (long)p_Var22) = 0;
  }
  return 0;
}

Assistant:

int DeformableConv2D_x86::create_pipeline(const Option& opt)
{
    activation = create_activation_layer(activation_type, activation_params, opt);

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    if (opt.use_sgemm_convolution)
    {
        const int maxk = kernel_w * kernel_h;

        gemm = ncnn::create_layer(ncnn::LayerType::Gemm);

        ncnn::ParamDict pd;
        pd.set(2, 0);                   // transA
        pd.set(3, 0);                   // transB
        pd.set(4, 1);                   // constantA
        pd.set(5, 0);                   // constantB
        pd.set(6, 1);                   // constantC
        pd.set(7, num_output);          // M = outch
        pd.set(8, 0);                   // N = size
        pd.set(9, maxk * num_input);    // K = maxk*inch
        pd.set(10, bias_term ? 1 : -1); // constant_broadcast_type_C = (M)
        pd.set(11, 1);                  // output_N1M

        gemm->load_param(pd);

        // maxk-inch-outch to pa-maxk-inch/pa-outch
        Mat tmp;
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

            tmp.create(maxk * num_input, num_output);

            for (int q = 0; q < num_output; q += 1)
            {
                float* g00 = tmp.row(q);

                for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        for (int i = 0; i < elempack; i++)
                        {
                            const float* k00 = weight_data_r2.channel(q).row(p + i);
                            g00[0] = k00[k];
                            g00++;
                        }
                    }
                }
            }
        }

        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = tmp;
            weights[1] = bias_data;

            gemm->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = tmp;

            gemm->load_model(ModelBinFromMatArray(weights));
        }

        gemm->create_pipeline(opt);
    }
    else if (elempack == 1 && out_elempack == 1)
    {
        weight_data_tm = weight_data;
    }
    else
    {
        deformableconv2d_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}